

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HApp.cpp
# Opt level: O3

int solveSCIP(char *filename)

{
  int iVar1;
  undefined8 uVar2;
  HModel model;
  HModel local_1198 [1548];
  uint local_b8c;
  int local_b88;
  
  HModel::HModel(local_1198);
  puts("Called solveSCIP");
  std::ostream::flush();
  iVar1 = HModel::load_fromMPS((char *)local_1198);
  if (iVar1 != 0) {
    HModel::~HModel(local_1198);
    return iVar1;
  }
  HModel::util_deleteCols((int)local_1198,local_b8c - 3);
  HModel::util_deleteRows((int)local_1198,local_b88 + -3);
  HModel::util_deleteRows((int)local_1198,0);
  HModel::util_deleteCols((int)local_1198,0);
  uVar2 = HModel::util_addCols
                    ((int)local_1198,(double *)(ulong)local_b8c,(double *)0x0,(double *)0x0,0,
                     (int *)0x0,(int *)0x0,(double *)0x0);
  HModel::~HModel(local_1198);
  _Unwind_Resume(uVar2);
}

Assistant:

int solveSCIP(const char *filename) {
  HModel model;
  printf("Called solveSCIP\n");cout << flush;
  int RtCd = model.load_fromMPS(filename);
  if (RtCd) return RtCd;
  //  model.util_reportModel();

  //Extract columns numCol-3..numCol-1
  int FmCol = model.numCol-3;
  int ToCol = model.numCol-1;
  int numExtractCols = ToCol-FmCol+1;
  vector<double> XcolCost;
  vector<double> XcolLower;
  vector<double> XcolUpper;
  vector<int> XAstart;
  vector<int> XAindex;
  vector<double> XAvalue;
  //  model.util_extractCols(FmCol, ToCol, XcolCost, XcolLower, XcolUpper,
  //			 XAstart, XAindex, XAvalue);

  //  printf("Returned from model.util_extractCols with\n");
  //  model.util_reportColVec(numExtractCols, XcolCost, XcolLower, XcolUpper);
  //  model.util_reportColMtx(numExtractCols, XAstart, XAindex, XAvalue);
  
  //Delete the columns just extracted
  model.util_deleteCols(FmCol, ToCol);
  //  model.util_reportModel();

  //Extract rows numRow-3..numRow-1
  int FmRow = model.numRow-3;
  int ToRow = model.numRow-1;
  int numExtractRows = ToRow-FmRow+1;
  vector<double> XrowLower;
  vector<double> XrowUpper;
  vector<int> XARstart;
  vector<int> XARindex;
  vector<double> XARvalue;
  //  model.util_extractRows(FmRow, ToRow, &(*XrowLower.begin()), &(*XrowUpper.begin()),
  // &(*XARstart.begin()), &(*XARindex.begin()), &(*XARvalue.begin()));

  //  printf("Returned from model.util_extractRows with\n");
  //  model.util_reportRowVec(numExtractRows, XrowLower, XrowUpper);
  //  model.util_reportRowMtx(numExtractRows, XARstart, XARindex, XARvalue);
  
  //Delete the rows just extracted
  model.util_deleteRows(FmRow, ToRow);
  //  model.util_reportModel();

  //Extract all remaining rows
  FmRow = 0;
  ToRow = model.numRow-1;
  int num0ExtractRows = ToRow-FmRow+1;
  vector<double> X0rowLower;
  vector<double> X0rowUpper;
  vector<int> X0ARstart;
  vector<int> X0ARindex;
  vector<double> X0ARvalue;

  //model.util_extractRows(FmRow, ToRow, &(*X0rowLower.begin()), &(*X0rowUpper.begin()),
  //			 &(*X0ARstart.begin()), &(*X0ARindex.begin()), &(*X0ARvalue.begin()));

  //Delete the rows just extracted
  model.util_deleteRows(FmRow, ToRow);
  //  model.util_reportModel();

  //Extract all remaining columns
  FmCol = 0;
  ToCol = model.numCol-1;
  int num0ExtractCols = ToCol-FmCol+1;
  vector<double> X0colCost;
  vector<double> X0colLower;
  vector<double> X0colUpper;
  vector<int> X0Astart;
  vector<int> X0Aindex;
  vector<double> X0Avalue;
  //  model.util_extractCols(FmCol, ToCol, X0colCost, X0colLower, X0colUpper,
  //			 X0Astart, X0Aindex, X0Avalue);
  
  //Delete the columns just extracted
  model.util_deleteCols(FmCol, ToCol);
  //  model.util_reportModel();

  int nnonz = 0;
  model.util_addCols(num0ExtractCols, &X0colCost[0], &X0colLower[0], &X0colUpper[0],
		     nnonz, &X0Astart[0], &X0Aindex[0], &X0Avalue[0]);
  //  model.util_reportModel();
  
  nnonz = X0ARstart[num0ExtractRows];
  model.util_addRows(num0ExtractRows, &X0rowLower[0], &X0rowUpper[0],
		     nnonz, &X0ARstart[0], &X0ARindex[0], &X0ARvalue[0]);
  //  model.util_reportModel();

  nnonz = XARstart[numExtractRows];
  model.util_addRows(numExtractRows, &XrowLower[0], &XrowUpper[0],
		     nnonz, &XARstart[0], &XARindex[0], &XARvalue[0]);
  //  model.util_reportModel();

  nnonz = XAstart[numExtractCols];
  model.util_addCols(numExtractCols, &XcolCost[0], &XcolLower[0], &XcolUpper[0],
		     nnonz, &XAstart[0], &XAindex[0], &XAvalue[0]);
  //  model.util_reportModel();
  
  model.numTot = model.numCol + model.numRow;
  model.scaleModel();
  HDual solver;
  solver.solve(&model);
  model.util_reportModelSolution();
  model.util_reportSolverOutcome("SCIP 1");

  vector<double> colPrimal(model.numCol);
  vector<double> colDual(model.numCol);
  vector<double> colLower(model.numCol);
  vector<double> colUpper(model.numCol);
  vector<double> rowPrimal(model.numRow);
  vector<double> rowDual(model.numRow);
  vector<double> rowLower(model.numRow);
  vector<double> rowUpper(model.numRow);
  model.util_getPrimalDualValues(colPrimal, colDual, rowPrimal, rowDual);
  model.util_getColBounds(0, model.numCol-1, &colLower[0], &colUpper[0]);
  model.util_getRowBounds(0, model.numRow-1, &rowLower[0], &rowUpper[0]);

  double og_colLower;
  double og_colUpper;
  int colBoundIndex;
  double nw_colLower;
  double nw_colUpper;

  int num_resolve = 0;
  for (int col = 0; col < model.numCol; col++) {
    model.util_getColBounds(col, col, &og_colLower, &og_colUpper);
    printf("\nColumn %2d has primal value %11g and bounds [%11g, %11g]", col, colPrimal[col], og_colLower, og_colUpper);
    if (model.nonbasicFlag[col]) {
      printf(": nonbasic so don't branch\n");
      continue;
    } else {
      double rsdu = min(colPrimal[col]-og_colLower, og_colUpper-colPrimal[col]);
      if (rsdu < 0.1) {
	printf(": basic but rsdu = %11g so don't branch\n", rsdu);
	continue;
      }
      printf(": basic with rsdu = %11g so branch\n\n", rsdu);
      num_resolve++;
      colBoundIndex = col;
      if (model.hsol_isInfinity(og_colUpper)) 
	nw_colLower = colPrimal[col]+1;
      else
	nw_colLower = og_colUpper;
      nw_colUpper = og_colUpper;
      printf("Calling model.util_chgColBounds(1, %d, %g, %g)\n", colBoundIndex, nw_colLower, nw_colUpper);
      model.util_chgColBoundsSet(1, &colBoundIndex, &nw_colLower, &nw_colUpper);
      printf("Calling model.scaleModel()\n");
      model.scaleModel();
      //      printf("Calling solver.solve(&model)\n");
      solver.solve(&model);
      //      printf("Called solver.solve(&model)\n");
      model.util_reportSolverOutcome("SCIP 2");
      //Was &nw_colLower, &nw_colUpper); and might be more interesting for avgas
      model.util_chgColBoundsSet(1, &colBoundIndex, &og_colLower, &og_colUpper);
      if (num_resolve >= 10) break;
    }
  }
  printf("Returning from solveSCIP\n"); cout << flush;
  return 0;
}